

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O0

void __thiscall
BSA_SpikeDecodingSynapse::BSA_SpikeDecodingSynapse
          (BSA_SpikeDecodingSynapse *this,Population *n_from,Population *n_to)

{
  BSA_SpikeDecodingSynapse_param *this_00;
  Synapse *in_RDI;
  Population *in_stack_00000090;
  Population *in_stack_00000098;
  BSA_SpikeDecodingSynapse *in_stack_000000a0;
  
  Synapse::Synapse(in_RDI);
  in_RDI->_vptr_Synapse = (_func_int **)&PTR_update_00132d78;
  this_00 = (BSA_SpikeDecodingSynapse_param *)operator_new(0x20);
  BSA_SpikeDecodingSynapse_param::BSA_SpikeDecodingSynapse_param(this_00);
  in_RDI[1]._vptr_Synapse = (_func_int **)this_00;
  std::
  vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
            *)0x126495);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1264a8);
  std::
  vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
            *)0x1264bb);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x1264ce);
  initialize(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  return;
}

Assistant:

BSA_SpikeDecodingSynapse::BSA_SpikeDecodingSynapse(Population* n_from, Population* n_to) : 
    param(new BSA_SpikeDecodingSynapse_param)
{
    initialize(n_from, n_to);
}